

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_resize_filter_arena(Parser *this,size_t num_characters)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char msg [39];
  char local_48 [48];
  
  uVar5 = (this->m_filter_arena).len;
  if (uVar5 < num_characters) {
    pcVar4 = (this->m_filter_arena).str;
    if (pcVar4 != (char *)0x0) {
      pcVar6 = pcVar4;
      if (uVar5 == 0) {
        builtin_strncpy(local_48,"check failed: (m_filter_arena.len > 0)",0x27);
        if (((byte)s_error_flags & 1) != 0) {
          bVar3 = is_debugger_attached();
          if (bVar3) {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
        }
        LVar2.super_LineCol.col = 0;
        LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7f77) << 0x40,0);
        LVar2.super_LineCol.line = SUB168(ZEXT816(0x7f77) << 0x40,8);
        LVar2.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar2.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_48,0x27,LVar2,(this->m_stack).m_callbacks.m_user_data);
        pcVar6 = (this->m_filter_arena).str;
        uVar5 = (this->m_filter_arena).len;
      }
      (*(this->m_stack).m_callbacks.m_free)(pcVar6,uVar5,(this->m_stack).m_callbacks.m_user_data);
      (this->m_filter_arena).str = (char *)0x0;
    }
    pcVar4 = (char *)(*(this->m_stack).m_callbacks.m_allocate)
                               (num_characters,pcVar4,(this->m_stack).m_callbacks.m_user_data);
    (this->m_filter_arena).str = pcVar4;
    (this->m_filter_arena).len = num_characters;
  }
  return;
}

Assistant:

void Parser::_resize_filter_arena(size_t num_characters)
{
    if(num_characters > m_filter_arena.len)
    {
        _c4dbgpf("resize: sz={}", num_characters);
        char *prev = m_filter_arena.str;
        if(m_filter_arena.str)
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_filter_arena.len > 0);
            _RYML_CB_FREE(m_stack.m_callbacks, m_filter_arena.str, char, m_filter_arena.len);
        }
        m_filter_arena.str = _RYML_CB_ALLOC_HINT(m_stack.m_callbacks, char, num_characters, prev);
        m_filter_arena.len = num_characters;
    }
}